

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O1

Branch * __thiscall testinator::Branch::pushChild(Branch *this,int line,char *file,char *name)

{
  list<testinator::Branch,_std::allocator<testinator::Branch>_> *this_00;
  size_t *psVar1;
  _Node *p_Var2;
  _List_node_base *p_Var3;
  int local_24;
  char *local_20;
  char *local_18;
  
  this_00 = &this->m_children;
  for (p_Var3 = (this->m_children).
                super__List_base<testinator::Branch,_std::allocator<testinator::Branch>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      (p_Var3 != (_List_node_base *)this_00 && (*(int *)&p_Var3[3]._M_next != line));
      p_Var3 = p_Var3->_M_next) {
  }
  if (p_Var3 == (_List_node_base *)this_00) {
    local_24 = line;
    local_20 = name;
    local_18 = file;
    p_Var2 = ::std::__cxx11::list<testinator::Branch,std::allocator<testinator::Branch>>::
             _M_create_node<int&,char_const*&,char_const*&>
                       ((list<testinator::Branch,std::allocator<testinator::Branch>> *)this_00,
                        &local_24,&local_18,&local_20);
    ::std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var2);
    psVar1 = &(this->m_children).
              super__List_base<testinator::Branch,_std::allocator<testinator::Branch>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    p_Var3 = (this->m_children).
             super__List_base<testinator::Branch,_std::allocator<testinator::Branch>_>._M_impl.
             _M_node.super__List_node_base._M_prev;
  }
  return (Branch *)(p_Var3 + 1);
}

Assistant:

Branch& pushChild(int line, const char* file, const char* name)
    {
      auto i = std::find_if(m_children.begin(), m_children.end(),
                            [=] (const Branch& r) { return r.m_id == line; });
      if (i != m_children.end()) return *i;

      m_children.emplace_back(line, file, name);
      return m_children.back();
    }